

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O3

GLuint deqp::egl::anon_unknown_0::anon_unknown_5::createTexture(Functions *gl,TestConfig *config)

{
  long lVar1;
  int iVar2;
  GLenum GVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uchar local_71;
  int local_70;
  GLuint texture;
  TestConfig *local_68;
  int local_5c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = config->textureWidth;
  local_68 = config;
  if (0 < iVar5) {
    iVar2 = config->textureHeight;
    local_70 = 0;
    iVar4 = 0;
    do {
      if (0 < iVar2) {
        lVar1 = (long)(iVar4 * 0xff) * 0x80808081;
        iVar6 = 0;
        iVar7 = 0;
        iVar5 = 0;
        local_5c = iVar4;
        do {
          local_71 = (char)(uint)((ulong)lVar1 >> 0x27) - (char)(lVar1 >> 0x3f);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&data,&local_71);
          local_71 = (char)(uint)((ulong)((long)iVar6 * 0x80808081) >> 0x27) -
                     (char)((long)iVar6 * 0x80808081 >> 0x3f);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&data,&local_71);
          local_71 = (char)(uint)((ulong)((long)iVar7 * 0x81018203) >> 0x2f) -
                     (char)((long)iVar7 * 0x81018203 >> 0x3f);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&data,&local_71);
          local_71 = 0xff;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&data,&local_71);
          iVar5 = iVar5 + 1;
          iVar2 = local_68->textureHeight;
          iVar7 = iVar7 + local_70;
          iVar6 = iVar6 + 0xff;
        } while (iVar5 < iVar2);
        iVar5 = local_68->textureWidth;
        iVar4 = local_5c;
      }
      iVar4 = iVar4 + 1;
      local_70 = local_70 + 0xff;
    } while (iVar4 < iVar5);
  }
  (*gl->genTextures)(1,&texture);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGenTextures()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x119);
  (*gl->bindTexture)(0xde1,texture);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glBindTexture()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x11b);
  (*gl->texParameteri)(0xde1,0x2801,0x2601);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x11d);
  (*gl->texParameteri)(0xde1,0x2800,0x2601);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x11f);
  (*gl->texParameteri)(0xde1,0x2803,0x812f);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x121);
  (*gl->texParameteri)(0xde1,0x2802,0x812f);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x123);
  (*gl->texImage2D)(0xde1,0,0x1908,local_68->textureWidth,local_68->textureWidth,0,0x1908,0x1401,
                    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glTexImage2D()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x125);
  (*gl->bindTexture)(0xde1,0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glBindTexture()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x127);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return texture;
}

Assistant:

GLuint createTexture (const glw::Functions& gl, const TestConfig& config)
{
	GLuint			texture;
	vector<deUint8>	data;

	createTextureData(data, config);

	gl.genTextures(1, &texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures()");
	gl.bindTexture(GL_TEXTURE_2D, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture()");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, config.textureWidth, config.textureWidth, 0, GL_RGBA, GL_UNSIGNED_BYTE, &(data[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D()");
	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture()");

	return texture;
}